

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveSelectStep(Walker *pWalker,Select *p)

{
  Parse *pParse;
  anon_union_8_14_c5524298_for_u pOuterNC;
  sqlite3 *psVar1;
  Select *pSVar2;
  Select *pSVar3;
  anon_union_8_14_c5524298_for_u aVar4;
  char *pcVar5;
  ExprList *pOrderBy;
  ushort uVar6;
  int iVar7;
  SrcList *pSVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ExprList_item *pEVar13;
  NameContext local_a0;
  Select *local_68;
  Walker local_60;
  
  iVar9 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (anon_union_8_14_c5524298_for_u)(pWalker->u).pNC;
    psVar1 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC.pNC);
      iVar9 = 2;
      if (pParse->nErr == 0) {
        iVar9 = 2 - (uint)(psVar1->mallocFailed == '\0');
      }
    }
    else {
      pSVar2 = p->pPrior;
      iVar9 = 0;
      local_68 = p;
      do {
        *(byte *)&p->selFlags = (byte)p->selFlags | 4;
        local_a0.pNext = (NameContext *)0x0;
        local_a0.nRef = 0;
        local_a0.nErr = 0;
        local_a0.pSrcList = (SrcList *)0x0;
        local_a0.uNC.pEList = (ExprList *)0x0;
        local_a0.ncFlags = 0;
        local_a0._42_6_ = 0;
        local_a0.pParse = pParse;
        local_a0.pWinSelect = p;
        iVar7 = sqlite3ResolveExprNames(&local_a0,p->pLimit);
        if (iVar7 != 0) {
          return 2;
        }
        pSVar8 = p->pSrc;
        if ((p->selFlags & 0x10000) != 0) {
          (pSVar8->a[0].pSelect)->pOrderBy = p->pOrderBy;
          p->pOrderBy = (ExprList *)0x0;
        }
        iVar7 = pSVar8->nSrc;
        if (0 < iVar7) {
          lVar12 = 0;
          do {
            pSVar3 = pSVar8->a[lVar12].pSelect;
            if (pSVar3 != (Select *)0x0) {
              iVar7 = 0;
              for (aVar4 = pOuterNC; aVar4.pNC != (NameContext *)0x0;
                  aVar4 = (anon_union_8_14_c5524298_for_u)(aVar4.pNC)->pNext) {
                iVar7 = iVar7 + (aVar4.pNC)->nRef;
              }
              pcVar11 = pParse->zAuthContext;
              pcVar5 = pSVar8->a[lVar12].zName;
              if (pcVar5 != (char *)0x0) {
                pParse->zAuthContext = pcVar5;
              }
              local_60.xExprCallback = resolveExprStep;
              local_60.xSelectCallback = resolveSelectStep;
              local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
              local_60.pParse = pParse;
              local_60.u = pOuterNC;
              sqlite3WalkSelect(&local_60,pSVar3);
              pParse->zAuthContext = pcVar11;
              if (pParse->nErr != 0) {
                return 2;
              }
              aVar4 = pOuterNC;
              if (psVar1->mallocFailed != '\0') {
                return 2;
              }
              for (; aVar4.pNC != (NameContext *)0x0; aVar4.pNC = (aVar4.pNC)->pNext) {
                iVar7 = iVar7 - (aVar4.pNC)->nRef;
              }
              pSVar8->a[lVar12].fg.field_0x1 =
                   pSVar8->a[lVar12].fg.field_0x1 & 0xf7 | (iVar7 != 0) << 3;
              pSVar8 = p->pSrc;
              iVar7 = pSVar8->nSrc;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar7);
        }
        local_a0.ncFlags = 0x4001;
        local_a0.pSrcList = pSVar8;
        local_a0.pNext = (NameContext *)pOuterNC;
        iVar7 = sqlite3ResolveExprListNames(&local_a0,p->pEList);
        if (iVar7 != 0) {
          return 2;
        }
        uVar6 = local_a0.ncFlags & 0xbfff;
        pOrderBy = p->pGroupBy;
        if ((byte)((byte)((local_a0.ncFlags & 0x10) >> 4) | pOrderBy != (ExprList *)0x0) == 1) {
          p->selFlags = local_a0.ncFlags & 0x1000 | p->selFlags | 8;
        }
        else {
          uVar6 = local_a0.ncFlags & 0xbfee;
        }
        local_a0.ncFlags = uVar6;
        if (p->pHaving != (Expr *)0x0 && pOrderBy == (ExprList *)0x0) {
          pcVar11 = "a GROUP BY clause is required before HAVING";
LAB_0017c81d:
          sqlite3ErrorMsg(pParse,pcVar11);
          return 2;
        }
        local_a0.uNC.pEList = p->pEList;
        local_a0._40_8_ = CONCAT62(local_a0._42_6_,uVar6) | 0x80;
        iVar7 = sqlite3ResolveExprNames(&local_a0,p->pHaving);
        if (iVar7 != 0) {
          return 2;
        }
        iVar7 = sqlite3ResolveExprNames(&local_a0,p->pWhere);
        if (iVar7 != 0) {
          return 2;
        }
        pSVar8 = p->pSrc;
        iVar7 = pSVar8->nSrc;
        if (0 < iVar7) {
          lVar12 = 0x68;
          lVar10 = 0;
          do {
            if ((*(byte *)((long)pSVar8->a + lVar12 + -0x2b) & 4) != 0) {
              iVar7 = sqlite3ResolveExprListNames
                                (&local_a0,*(ExprList **)((long)pSVar8->a + lVar12 + -8));
              if (iVar7 != 0) {
                return 2;
              }
              pSVar8 = p->pSrc;
              iVar7 = pSVar8->nSrc;
            }
            lVar10 = lVar10 + 1;
            lVar12 = lVar12 + 0x70;
          } while (lVar10 < iVar7);
        }
        local_a0.pNext = (NameContext *)0x0;
        local_a0._40_8_ = local_a0._40_8_ | 0x4001;
        if ((p->selFlags & 0x10000) != 0) {
          pSVar3 = pSVar8->a[0].pSelect;
          p->pOrderBy = pSVar3->pOrderBy;
          pSVar3->pOrderBy = (ExprList *)0x0;
        }
        if ((pSVar2 == (Select *)0x0 || iVar9 != 0) &&
           (iVar7 = resolveOrderGroupBy(&local_a0,p,p->pOrderBy,"ORDER"), iVar7 != 0)) {
          return 2;
        }
        if (psVar1->mallocFailed != '\0') {
          return 2;
        }
        local_a0._40_8_ = local_a0._40_8_ & 0xffffffffffffbfff;
        if (pOrderBy != (ExprList *)0x0) {
          iVar7 = resolveOrderGroupBy(&local_a0,p,pOrderBy,"GROUP");
          if (iVar7 != 0) {
            return 2;
          }
          if (psVar1->mallocFailed != '\0') {
            return 2;
          }
          iVar7 = pOrderBy->nExpr;
          if (0 < iVar7) {
            pEVar13 = pOrderBy->a;
            do {
              if ((pEVar13->pExpr->flags & 2) != 0) {
                pcVar11 = "aggregate functions are not allowed in the GROUP BY clause";
                goto LAB_0017c81d;
              }
              pEVar13 = pEVar13 + 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        pSVar3 = p->pNext;
        if ((pSVar3 != (Select *)0x0) && (p->pEList->nExpr != pSVar3->pEList->nExpr)) {
          sqlite3SelectWrongNumTermsError(pParse,pSVar3);
          return 2;
        }
        p = p->pPrior;
        iVar9 = iVar9 + 1;
      } while (p != (Select *)0x0);
      iVar9 = 2;
      if ((pSVar2 == (Select *)0x0) || (iVar7 = resolveCompoundOrderBy(pParse,local_68), iVar7 == 0)
         ) {
        iVar9 = 1;
      }
    }
  }
  return iVar9;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}